

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubDMeshImpl::AddFinishedFragment(ON_SubDMeshImpl *this,ON_SubDMeshFragment *finished_fragment)

{
  uint uVar1;
  ON_SubDMeshFragment *finished_fragment_local;
  ON_SubDMeshImpl *this_local;
  
  if (finished_fragment == (ON_SubDMeshFragment *)0x0) {
    ON_SubDIncrementErrorCount();
  }
  else {
    uVar1 = ON_SubDMeshFragment::PointCount(finished_fragment);
    if ((uVar1 != 0) && (uVar1 = ON_SubDMeshFragment::NormalCount(finished_fragment), uVar1 != 0)) {
      uVar1 = ON_SubDMeshFragment::PointCount(finished_fragment);
      if (this->m_fragment_point_count < uVar1) {
        ON_SubDIncrementErrorCount();
        return false;
      }
      this->m_fragment_count = this->m_fragment_count + 1;
      if (this->m_first_fragment == (ON_SubDMeshFragment *)0x0) {
        this->m_first_fragment = finished_fragment;
        this->m_last_fragment = finished_fragment;
        memcpy(&this->m_bbox,&finished_fragment->m_surface_bbox,0x30);
      }
      else {
        this->m_last_fragment->m_next_fragment = finished_fragment;
        finished_fragment->m_prev_fragment = this->m_last_fragment;
        this->m_last_fragment = finished_fragment;
        ON_BoundingBox::Union(&this->m_bbox,&finished_fragment->m_surface_bbox);
      }
      ChangeContentSerialNumber(this);
      return true;
    }
    ON_SubDIncrementErrorCount();
  }
  return false;
}

Assistant:

bool ON_SubDMeshImpl::AddFinishedFragment(
  ON_SubDMeshFragment* finished_fragment
  )
{
  if ( nullptr == finished_fragment)
    return ON_SUBD_RETURN_ERROR(false);
  if ( 0 == finished_fragment->PointCount() || 0 == finished_fragment->NormalCount() )
    return ON_SUBD_RETURN_ERROR(false);
  if ( finished_fragment->PointCount() > m_fragment_point_count )
    return ON_SUBD_RETURN_ERROR(false);

  m_fragment_count++;

  if (nullptr == m_first_fragment)
  {
    m_first_fragment = finished_fragment;
    m_last_fragment = finished_fragment;
    m_bbox = finished_fragment->m_surface_bbox;
  }
  else
  {
    m_last_fragment->m_next_fragment = finished_fragment;
    finished_fragment->m_prev_fragment = m_last_fragment;
    m_last_fragment = finished_fragment;
    m_bbox.Union(finished_fragment->m_surface_bbox);
  }

  ChangeContentSerialNumber();

  return true;
}